

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

void __thiscall
QTextDocumentLayoutPrivate::drawTableCell
          (QTextDocumentLayoutPrivate *this,QRectF *cellRect,QPainter *painter,
          PaintContext *cell_context,QTextTable *table,QTextTableData *td,int r,int c,
          QTextBlock *cursorBlockNeedingRepaint,QPointF *cursorBlockOffset)

{
  Iterator it;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QFixed QVar5;
  QFixed QVar6;
  int iVar7;
  int iVar8;
  BorderStyle style;
  QBrush *other;
  QPen *p;
  QPoint QVar9;
  int iVar10;
  long in_FS_OFFSET;
  double bottomMargin;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  QRect QVar18;
  QSizeF QVar19;
  QBrush bg;
  QPen oldPen;
  QBrush oldBrush;
  double local_128;
  int local_e4;
  QBrush local_e0;
  QBrush local_d8;
  undefined1 local_d0 [8];
  iterator local_c8;
  undefined1 local_a8 [32];
  undefined1 local_88 [24];
  undefined8 uStack_70;
  undefined1 local_68 [8];
  qreal qStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextTable::cellAt((QTextTable *)local_48,(int)table,r);
  iVar3 = QTextTableCell::rowSpan((QTextTableCell *)local_48);
  iVar4 = QTextTableCell::columnSpan((QTextTableCell *)local_48);
  if (iVar3 != 1) {
    iVar3 = QTextTableCell::row((QTextTableCell *)local_48);
    if (iVar3 != r) goto LAB_0047111c;
  }
  if (iVar4 != 1) {
    iVar3 = QTextTableCell::column((QTextTableCell *)local_48);
    if (iVar3 != c) goto LAB_0047111c;
  }
  QVar5 = QTextTableData::leftPadding(td,table,(QTextTableCell *)local_48);
  QVar6 = QTextTableData::topPadding(td,table,(QTextTableCell *)local_48);
  iVar10 = (td->super_QTextFrameData).border.val + (td->cellSpacing).val;
  local_128 = (double)((td->super_QTextFrameData).effectiveTopMargin.val + iVar10) * 0.015625;
  iVar3 = (td->super_QTextFrameData).effectiveBottomMargin.val;
  QTextTable::format((QTextTable *)local_88);
  iVar7 = QTextTableFormat::headerRowCount((QTextTableFormat *)local_88);
  iVar8 = QTextTable::rows(table);
  iVar4 = iVar8 + -1;
  if (iVar7 < iVar8 + -1) {
    iVar4 = iVar7;
  }
  QTextFormat::~QTextFormat((QTextFormat *)local_88);
  if (iVar4 <= r) {
    local_128 = local_128 + (double)(td->headerHeight).val * 0.015625;
  }
  QTextTableCell::format((QTextTableCell *)local_88);
  bVar1 = QTextFormat::hasProperty((QTextFormat *)local_88,0x4818);
  bVar2 = true;
  if (!bVar1) {
    QTextTableCell::format((QTextTableCell *)local_a8);
    bVar1 = QTextFormat::hasProperty((QTextFormat *)local_a8,0x4816);
    bVar2 = true;
    if (!bVar1) {
      QTextTableCell::format((QTextTableCell *)local_58);
      bVar1 = QTextFormat::hasProperty((QTextFormat *)local_58,0x4819);
      bVar2 = true;
      if (!bVar1) {
        QTextTableCell::format((QTextTableCell *)local_68);
        bVar2 = QTextFormat::hasProperty((QTextFormat *)local_68,0x4817);
        QTextFormat::~QTextFormat((QTextFormat *)local_68);
      }
      QTextFormat::~QTextFormat((QTextFormat *)local_58);
    }
    QTextFormat::~QTextFormat((QTextFormat *)local_a8);
  }
  bottomMargin = (double)(iVar10 + iVar3) * 0.015625;
  QTextFormat::~QTextFormat((QTextFormat *)local_88);
  if ((td->borderCollapse == false) &&
     ((td->super_QTextFrameData).border.val != 0 && bVar2 == false)) {
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    other = QPainter::brush(painter);
    QBrush::QBrush((QBrush *)local_58,other);
    local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    p = QPainter::pen(painter);
    QPen::QPen((QPen *)local_68,p);
    local_88._8_8_ = cellRect->yp + -1.0;
    local_88._0_8_ = cellRect->xp + -1.0;
    uStack_70 = cellRect->h + 1.0;
    local_88._16_8_ = cellRect->w + 1.0;
    QTextTable::format((QTextTable *)local_a8);
    style = QTextFrameFormat::borderStyle((QTextFrameFormat *)local_a8);
    QTextFormat::~QTextFormat((QTextFormat *)local_a8);
    if (style - BorderStyle_Groove < 4) {
      style = *(BorderStyle *)(&DAT_005fb5a0 + (ulong)(style - BorderStyle_Groove) * 4);
    }
    QTextTable::format((QTextTable *)local_a8);
    QTextFrameFormat::borderBrush((QTextFrameFormat *)local_d0);
    drawBorder(this,painter,(QRectF *)local_88,local_128,bottomMargin,1.0,(QBrush *)local_d0,style);
    QBrush::~QBrush((QBrush *)local_d0);
    QTextFormat::~QTextFormat((QTextFormat *)local_a8);
    QPainter::setBrush(painter,(QBrush *)local_58);
    QPainter::setPen(painter,(QPen *)local_68);
    QPen::~QPen((QPen *)local_68);
    QBrush::~QBrush((QBrush *)local_58);
  }
  local_d0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QTextTableCell::format((QTextTableCell *)local_88);
  QTextFormat::background((QTextFormat *)local_d0);
  QTextFormat::~QTextFormat((QTextFormat *)local_88);
  QVar9 = QPainter::brushOrigin(painter);
  local_58._0_8_ = (undefined8)QVar9.xp.m_i.m_i;
  local_58._8_8_ = (undefined8)QVar9.yp.m_i.m_i;
  if (*(int *)((long)local_d0 + 4) != 0) {
    QVar19 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
    dVar14 = QVar19.ht;
    if (dVar14 <= 0.0) {
LAB_00470f07:
      QBrush::QBrush(&local_d8,(QBrush *)local_d0);
      local_a8._0_16_ = *(undefined1 (*) [16])cellRect;
      stack0xffffffffffffff88 = (undefined1  [16])0x0;
      local_88._0_8_ = (totally_ordered_wrapper<QTextFormatPrivate_*>)0x0;
      local_88._8_4_ = 0;
      local_88._12_4_ = 0;
      fillBackground(painter,cellRect,&local_d8,(QPointF *)local_a8,(QRectF *)local_88);
      QBrush::~QBrush(&local_d8);
    }
    else {
      auVar12._8_8_ = cellRect->h + cellRect->yp;
      auVar12._0_8_ = cellRect->yp;
      auVar13._8_8_ = dVar14;
      auVar13._0_8_ = dVar14;
      auVar13 = divpd(auVar12,auVar13);
      iVar3 = (int)auVar13._0_8_;
      if (iVar3 == (int)auVar13._8_8_) goto LAB_00470f07;
      while (iVar3 <= (int)auVar13._8_8_) {
        uStack_70._0_4_ = 0xffffffff;
        local_88._16_8_ = 0xffffffffffffffff;
        uStack_70._4_4_ = 0xffffffff;
        local_88._8_4_ = 0xffffffff;
        local_88._0_8_ = 0xffffffffffffffff;
        local_88._12_4_ = 0xffffffff;
        QVar18 = QRectF::toRect(cellRect);
        dVar11 = (double)QVar18.y1.m_i.m_i;
        dVar15 = (double)iVar3 * dVar14 + local_128;
        dVar16 = (cell_context->clip).yp;
        dVar17 = dVar16;
        if (dVar16 <= dVar15) {
          dVar17 = dVar15;
        }
        iVar3 = iVar3 + 1;
        dVar15 = (double)iVar3 * dVar14 + -bottomMargin;
        dVar16 = dVar16 + (cell_context->clip).h;
        if (dVar16 <= dVar15) {
          dVar15 = dVar16;
        }
        if (dVar17 <= dVar11) {
          dVar17 = dVar11;
        }
        local_88._8_8_ = dVar11 + (dVar17 - dVar11);
        local_88._0_8_ = (double)QVar18.x1.m_i.m_i;
        dVar16 = ((double)(((QVar18._8_8_ >> 0x20) - (QVar18._0_8_ >> 0x20)) + 1) -
                 (dVar17 - dVar11)) + (double)local_88._8_8_;
        if (dVar15 <= dVar16) {
          dVar16 = dVar15;
        }
        uStack_70 = dVar16 - (double)local_88._8_8_;
        local_88._16_8_ = (double)(((long)QVar18.x2.m_i.m_i - (long)QVar18.x1.m_i.m_i) + 1);
        if ((double)local_88._8_8_ < (dVar16 - (double)local_88._8_8_) + (double)local_88._8_8_) {
          QBrush::QBrush(&local_e0,(QBrush *)local_d0);
          local_68 = (undefined1  [8])cellRect->xp;
          qStack_60 = cellRect->yp;
          local_a8._16_16_ = (undefined1  [16])0x0;
          local_a8._0_8_ = (totally_ordered_wrapper<QTextFormatPrivate_*>)0x0;
          local_a8._8_4_ = 0;
          local_a8._12_4_ = 0;
          fillBackground(painter,(QRectF *)local_88,&local_e0,(QPointF *)local_68,(QRectF *)local_a8
                        );
          QBrush::~QBrush(&local_e0);
        }
      }
    }
    if (1 < *(int *)((long)local_d0 + 4)) {
      local_88._0_16_ = *(undefined1 (*) [16])cellRect;
      QPainter::setBrushOrigin(painter,(QPointF *)local_88);
    }
  }
  if (bVar2 != false) {
    drawTableCellBorder(this,cellRect,painter,table,td,(QTextTableCell *)local_48);
  }
  iVar3 = QTextTable::columns(table);
  local_68 = (undefined1  [8])0x0;
  local_a8._8_8_ =
       (double)(QVar6.val + (td->cellVerticalOffsets).d.ptr[iVar3 * r + c].val) * 0.015625 +
       cellRect->yp;
  local_a8._0_8_ = (double)QVar5.val * 0.015625 + cellRect->xp;
  qStack_60 = -3.720660661677042e-103;
  QTextTableCell::begin(&local_c8,(QTextTableCell *)local_48);
  iVar3 = QTextTable::rows(table);
  local_e4 = iVar3 * c + r;
  QMultiHash<int,_QTextFrame_*>::valuesImpl<int>
            ((QList<QTextFrame_*> *)local_88,&td->childFrameMap,&local_e4);
  it.b = local_c8.b;
  it.e = local_c8.e;
  it.f = local_c8.f;
  it.cf = local_c8.cf;
  it.cb = local_c8.cb;
  it._28_4_ = local_c8._28_4_;
  drawFlow(this,(QPointF *)local_a8,painter,cell_context,it,(QList<QTextFrame_*> *)local_88,
           (QTextBlock *)local_68);
  QArrayDataPointer<QTextFrame_*>::~QArrayDataPointer((QArrayDataPointer<QTextFrame_*> *)local_88);
  bVar1 = QTextBlock::isValid((QTextBlock *)local_68);
  if (bVar1) {
    cursorBlockNeedingRepaint->p = (QTextDocumentPrivate *)local_68;
    cursorBlockNeedingRepaint->n = qStack_60._0_4_;
    cursorBlockOffset->xp = (qreal)local_a8._0_8_;
    cursorBlockOffset->yp = (qreal)local_a8._8_8_;
  }
  if (1 < *(int *)((long)local_d0 + 4)) {
    QPainter::setBrushOrigin(painter,(QPointF *)local_58);
  }
  QBrush::~QBrush((QBrush *)local_d0);
LAB_0047111c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentLayoutPrivate::drawTableCell(const QRectF &cellRect, QPainter *painter, const QAbstractTextDocumentLayout::PaintContext &cell_context,
                                               QTextTable *table, QTextTableData *td, int r, int c,
                                               QTextBlock *cursorBlockNeedingRepaint, QPointF *cursorBlockOffset) const
{
    QTextTableCell cell = table->cellAt(r, c);
    int rspan = cell.rowSpan();
    int cspan = cell.columnSpan();
    if (rspan != 1) {
        int cr = cell.row();
        if (cr != r)
            return;
    }
    if (cspan != 1) {
        int cc = cell.column();
        if (cc != c)
            return;
    }

    const QFixed leftPadding = td->leftPadding(table, cell);
    const QFixed topPadding = td->topPadding(table, cell);

    qreal topMargin = (td->effectiveTopMargin + td->cellSpacing + td->border).toReal();
    qreal bottomMargin = (td->effectiveBottomMargin + td->cellSpacing + td->border).toReal();

    const int headerRowCount = qMin(table->format().headerRowCount(), table->rows() - 1);
    if (r >= headerRowCount)
        topMargin += td->headerHeight.toReal();

    // If cell border configured, don't draw default border for cells. It will be taken care later by
    // drawTableCellBorder().
    bool cellBorderConfigured = (cell.format().hasProperty(QTextFormat::TableCellLeftBorder) ||
                                 cell.format().hasProperty(QTextFormat::TableCellTopBorder) ||
                                 cell.format().hasProperty(QTextFormat::TableCellRightBorder) ||
                                 cell.format().hasProperty(QTextFormat::TableCellBottomBorder));

    if (!td->borderCollapse && td->border != 0 && !cellBorderConfigured) {
        const QBrush oldBrush = painter->brush();
        const QPen oldPen = painter->pen();

        // If border is configured for the table (and not explicitly for the cell), then
        // always draw 1px border around the cell
        const qreal border = 1;

        QRectF borderRect(cellRect.left() - border, cellRect.top() - border, cellRect.width() + border, cellRect.height() + border);

        // invert the border style for cells
        QTextFrameFormat::BorderStyle cellBorder = table->format().borderStyle();
        switch (cellBorder) {
        case QTextFrameFormat::BorderStyle_Inset:
            cellBorder = QTextFrameFormat::BorderStyle_Outset;
            break;
        case QTextFrameFormat::BorderStyle_Outset:
            cellBorder = QTextFrameFormat::BorderStyle_Inset;
            break;
        case QTextFrameFormat::BorderStyle_Groove:
            cellBorder = QTextFrameFormat::BorderStyle_Ridge;
            break;
        case QTextFrameFormat::BorderStyle_Ridge:
            cellBorder = QTextFrameFormat::BorderStyle_Groove;
            break;
        default:
            break;
        }

        drawBorder(painter, borderRect, topMargin, bottomMargin,
                   border, table->format().borderBrush(), cellBorder);

        painter->setBrush(oldBrush);
        painter->setPen(oldPen);
    }

    const QBrush bg = cell.format().background();
    const QPointF brushOrigin = painter->brushOrigin();
    if (bg.style() != Qt::NoBrush) {
        const qreal pageHeight = document->pageSize().height();
        const int topPage = pageHeight > 0 ? static_cast<int>(cellRect.top() / pageHeight) : 0;
        const int bottomPage = pageHeight > 0 ? static_cast<int>((cellRect.bottom()) / pageHeight) : 0;

        if (topPage == bottomPage)
            fillBackground(painter, cellRect, bg, cellRect.topLeft());
        else {
            for (int i = topPage; i <= bottomPage; ++i) {
                QRectF clipped = cellRect.toRect();

                if (topPage != bottomPage) {
                    const qreal top = qMax(i * pageHeight + topMargin, cell_context.clip.top());
                    const qreal bottom = qMin((i + 1) * pageHeight - bottomMargin, cell_context.clip.bottom());

                    clipped.setTop(qMax(clipped.top(), top));
                    clipped.setBottom(qMin(clipped.bottom(), bottom));

                    if (clipped.bottom() <= clipped.top())
                        continue;

                    fillBackground(painter, clipped, bg, cellRect.topLeft());
                }
            }
        }

        if (bg.style() > Qt::SolidPattern)
            painter->setBrushOrigin(cellRect.topLeft());
    }

    // paint over the background - otherwise we would have to adjust the background paint cellRect for the border values
    if (cellBorderConfigured)
        drawTableCellBorder(cellRect, painter, table, td, cell);

    const QFixed verticalOffset = td->cellVerticalOffsets.at(c + r * table->columns());

    const QPointF cellPos = QPointF(cellRect.left() + leftPadding.toReal(),
                                    cellRect.top() + (topPadding + verticalOffset).toReal());

    QTextBlock repaintBlock;
    drawFlow(cellPos, painter, cell_context, cell.begin(),
             td->childFrameMap.values(r + c * table->rows()),
             &repaintBlock);
    if (repaintBlock.isValid()) {
        *cursorBlockNeedingRepaint = repaintBlock;
        *cursorBlockOffset = cellPos;
    }

    if (bg.style() > Qt::SolidPattern)
        painter->setBrushOrigin(brushOrigin);
}